

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::write_double<double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
           *this,double value,format_specs *spec)

{
  bool bVar1;
  alignment aVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *this_00;
  align_spec *in_RSI;
  double in_XMM0_Qa;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  float_spec_handler *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  char spec_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffd08;
  char *pcVar3;
  write_inf_or_nan_t *in_stack_fffffffffffffd10;
  char local_2e1;
  undefined1 in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd31;
  double in_stack_fffffffffffffd38;
  core_format_specs in_stack_fffffffffffffd40;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  undefined4 in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined1 local_259 [545];
  undefined8 local_38;
  undefined8 local_30;
  undefined2 local_28;
  char local_24;
  char local_1b;
  float_spec_handler local_1a;
  align_spec *local_18;
  double local_10;
  
  spec_00 = (char)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  float_spec_handler::float_spec_handler(&local_1a,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>(spec_00,in_stack_fffffffffffffcf8);
  local_1b = '\0';
  bVar1 = std::signbit(local_10);
  if (bVar1) {
    local_1b = '-';
    local_10 = -local_10;
  }
  else {
    bVar1 = core_format_specs::has((core_format_specs *)(local_18 + 1),1);
    if (bVar1) {
      bVar1 = core_format_specs::has((core_format_specs *)(local_18 + 1),2);
      local_2e1 = '+';
      if (!bVar1) {
        local_2e1 = ' ';
      }
      local_1b = local_2e1;
    }
  }
  local_38._0_4_ = local_18->width_;
  local_38._4_4_ = local_18->fill_;
  local_30 = *(undefined8 *)&local_18->align_;
  local_28 = (undefined2)local_18[1].fill_;
  local_24 = local_1b;
  bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<double>
                    ((double)in_stack_fffffffffffffcf8);
  if (bVar1) {
    if ((local_1a.upper & 1U) == 0) {
      pcVar3 = "nan";
    }
    else {
      pcVar3 = "NAN";
    }
    write_double<double>::write_inf_or_nan_t::operator()
              ((write_inf_or_nan_t *)pcVar3,in_stack_fffffffffffffd08);
  }
  else {
    bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<double>
                      ((double)in_stack_fffffffffffffcf8);
    if (bVar1) {
      if ((local_1a.upper & 1U) == 0) {
        pcVar3 = "inf";
      }
      else {
        pcVar3 = "INF";
      }
      write_double<double>::write_inf_or_nan_t::operator()(in_stack_fffffffffffffd10,pcVar3);
    }
    else {
      this_01 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_259;
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                (this_01,(allocator<char> *)in_stack_fffffffffffffcf8);
      std::allocator<char>::~allocator((allocator<char> *)local_259);
      in_stack_fffffffffffffd90 = in_stack_fffffffffffffd90 & 0xffffff;
      uVar6 = (undefined1)local_18[1].fill_;
      uVar7 = (undefined2)((uint)local_18[1].fill_ >> 0x10);
      uVar4 = (undefined4)*(undefined8 *)&local_18->align_;
      uVar5 = (undefined4)((ulong)*(undefined8 *)&local_18->align_ >> 0x20);
      internal::sprintf_format<double>
                (in_stack_fffffffffffffd38,
                 (buffer *)CONCAT71(in_stack_fffffffffffffd31,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd40);
      internal::basic_buffer<char>::size((basic_buffer<char> *)(local_259 + 1));
      aVar2 = align_spec::align(local_18);
      if (aVar2 == ALIGN_NUMERIC) {
        if (local_1b != '\0') {
          this_00 = reserve((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                             *)this_01,(size_t)in_stack_fffffffffffffcf8);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator++
                    (this_00,0);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator*
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                     &stack0xfffffffffffffd40);
          std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator=
                    ((back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                     this_01,(value_type *)this_00);
          local_1b = '\0';
        }
      }
      else {
        align_spec::align(local_18);
      }
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::double_writer>
                ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                  *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (align_spec *)
                 CONCAT44(in_stack_fffffffffffffd8c,CONCAT22(uVar7,CONCAT11(local_1a.type,uVar6))),
                 (double_writer *)CONCAT44(uVar5,uVar4));
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_01);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}